

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_int_2_suite::test_one(void)

{
  moment<int,_2> filter;
  size_type local_68;
  uint local_5c;
  basic_moment<int,_2UL,_(trial::online::with)1> local_58;
  
  local_58.member.window.super_span<int,_2UL>.member.data = (pointer)&local_58;
  local_58.member.window.super_span<int,_2UL>.member.size = 0;
  local_58.member.window.super_span<int,_2UL>.member.next = 2;
  local_58.member.mean = 0;
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)
             local_58.member.window.super_span<int,_2UL>.member.data,1);
  local_5c = local_5c & 0xffffff00;
  local_68._0_1_ = local_58.member.window.super_span<int,_2UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x198,"void mean_int_2_suite::test_one()",&local_68,&local_5c);
  local_68 = CONCAT71(local_68._1_7_,local_58.member.window.super_span<int,_2UL>.member.size == 2);
  local_5c = local_5c & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x199,"void mean_int_2_suite::test_one()",&local_68,&local_5c);
  local_68 = local_58.member.window.super_span<int,_2UL>.member.size;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x19a,"void mean_int_2_suite::test_one()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x19b,"void mean_int_2_suite::test_one()",&local_68,&local_5c);
  return;
}

Assistant:

void test_one()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1);
}